

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

iterator * __thiscall
google::
dense_hashtable<int,int,Hasher,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>::Identity,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>::SetKey,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>
::insert_at<int_const&>
          (iterator *__return_storage_ptr__,
          dense_hashtable<int,int,Hasher,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>::Identity,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>::SetKey,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>
          *this,size_type pos,int *args)

{
  int *piVar1;
  int iVar2;
  dense_hashtable<int,int,Hasher,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>::Identity,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>::SetKey,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>
  dVar3;
  int iVar4;
  long lVar5;
  length_error *this_00;
  
  dVar3 = this[0x34];
  if ((char)((char)this[0x35] - (char)dVar3) == -1) {
    this_00 = (length_error *)__cxa_allocate_exception(0x10);
    std::length_error::length_error(this_00,"insert overflow");
    __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
  }
  lVar5 = *(long *)(this + 0x48);
  if (dVar3 != (dense_hashtable<int,int,Hasher,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>::Identity,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>::SetKey,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>
                )0x0) {
    iVar4 = *(int *)(this + 0x28);
    iVar2 = *(int *)(lVar5 + (ulong)pos * 4);
    *(int *)(this + 0x28) = iVar4 + 1;
    if (*(int *)(this + 0x2c) == iVar2) {
      *(int *)(this + 0x28) = iVar4 + 2;
      this[0x34] = (dense_hashtable<int,int,Hasher,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>::Identity,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>::SetKey,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>
                    )((char)dVar3 + -1);
      goto LAB_00a2ab7b;
    }
  }
  this[0x35] = (dense_hashtable<int,int,Hasher,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>::Identity,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>::SetKey,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>
                )((char)this[0x35] + '\x01');
LAB_00a2ab7b:
  piVar1 = (int *)(lVar5 + (ulong)pos * 4);
  *piVar1 = *args;
  dVar3 = this[0x36];
  __return_storage_ptr__->ht =
       (dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>
        *)this;
  __return_storage_ptr__->pos = piVar1;
  __return_storage_ptr__->end = (pointer)(lVar5 + (ulong)(byte)dVar3 * 4);
  return __return_storage_ptr__;
}

Assistant:

size_type size() const { return num_elements - num_deleted; }